

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry * NscBuildExpression(CNscPStackEntry *pExpression,CNscPStackEntry *pAssignment)

{
  byte *pbVar1;
  uchar *__src;
  size_t nSize;
  CNwnDoubleLinkList *pCVar2;
  CNscPStackEntry *pCVar3;
  CNscContext *pCVar4;
  CNwnDoubleLinkList *pCVar5;
  
  if ((pExpression == (CNscPStackEntry *)0x0) &&
     (pExpression = CNscContext::GetPStackEntryInt(g_pCtx), pExpression->m_nType != NscType_Unknown)
     ) {
LAB_0015029f:
    __assert_fail("m_nType == NscType_Unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0xee,"void CNscPStackEntry::SetType(NscType)");
  }
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pAssignment == (CNscPStackEntry *)0x0) {
      return pExpression;
    }
  }
  else {
    if (pExpression->m_nType != NscType_Unknown) goto LAB_0015029f;
    pExpression->m_nType = pAssignment->m_nType;
    __src = pAssignment->m_pauchData;
    nSize = pAssignment->m_nDataSize;
    CNscPStackEntry::MakeRoom(pExpression,nSize);
    memcpy(pExpression->m_pauchData + pExpression->m_nDataSize,__src,nSize);
    pExpression->m_nDataSize = pExpression->m_nDataSize + nSize;
    pbVar1 = (byte *)((long)&pExpression->m_ulFlags + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  pCVar4 = g_pCtx;
  pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar3 = (CNscPStackEntry *)(pAssignment->m_link).m_pNext;
  if (pCVar3 != pAssignment) {
    pCVar5 = (pAssignment->m_link).m_pPrev;
    (pCVar3->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
    (pAssignment->m_link).m_pNext = &pAssignment->m_link;
  }
  pCVar5 = &pCVar4->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pAssignment) {
    pCVar5 = pCVar2;
  }
  pCVar2 = pCVar5->m_pNext;
  (pAssignment->m_link).m_pNext = pCVar2;
  (pAssignment->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pAssignment->m_link;
  pCVar2->m_pPrev = &pAssignment->m_link;
  return pExpression;
}

Assistant:

YYSTYPE NscBuildExpression (YYSTYPE pExpression, YYSTYPE pAssignment)
{

	//
	// NOTE: Currently, we do not support commas in expressions 
	// (i.e. int i = 5, 6)
	//

	CNscPStackEntry *pOut = pExpression;
	
	//
	// If there isn't an expression, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pAssignment)
			g_pCtx ->FreePStackEntry (pAssignment);
		return pOut;
	}
	
	//
	// Process the assignment
	//

	pOut ->SetType (pAssignment ->GetType ());
	pOut ->AppendData (pAssignment);
	pOut ->SetFlags (pOut ->GetFlags () | NscSymFlag_InExpression);
	g_pCtx ->FreePStackEntry (pAssignment);

	//
	// Return the new expression
	//

	return pOut;
}